

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

double __thiscall despot::Parser::GetReward(Parser *this,ACT_TYPE action)

{
  reference pvVar1;
  size_type sVar2;
  const_reference pvVar3;
  double extraout_XMM0_Qa;
  int local_24;
  double dStack_20;
  int r;
  double reward;
  ACT_TYPE action_local;
  Parser *this_local;
  
  pvVar1 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                     (&this->action_vars_,0);
  (pvVar1->super_Variable).curr_value = action;
  dStack_20 = 0.0;
  local_24 = 0;
  while( true ) {
    sVar2 = std::vector<despot::Function,_std::allocator<despot::Function>_>::size
                      (&this->reward_funcs_);
    if (sVar2 <= (ulong)(long)local_24) break;
    pvVar3 = std::vector<despot::Function,_std::allocator<despot::Function>_>::operator[]
                       (&this->reward_funcs_,(long)local_24);
    (*pvVar3->_vptr_Function[5])(pvVar3,0);
    dStack_20 = extraout_XMM0_Qa + dStack_20;
    local_24 = local_24 + 1;
  }
  return dStack_20;
}

Assistant:

double Parser::GetReward(ACT_TYPE action) const {
	action_vars_[0].curr_value = action;

	double reward = 0;
	for (int r = 0; r < reward_funcs_.size(); r++)
		reward += reward_funcs_[r].GetValue();
	return reward;
}